

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::CreateScriptContext_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  TTD_LOG_PTR_ID val;
  
  if (evt->EventKind == CreateScriptContextActionTag) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    val._0_4_ = evt[1].EventKind;
    val._4_4_ = evt[1].ResultStatus;
    FileWriter::WriteLogTag(writer,logTag,val,NoSeparator);
    FileWriter::WriteLogTag(writer,logTag,*(TTD_LOG_PTR_ID *)evt[1].EventTimeStamp,CommaSeparator);
    FileWriter::WriteLogTag
              (writer,logTag,*(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 8),CommaSeparator);
    FileWriter::WriteLogTag
              (writer,logTag,*(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 0x10),CommaSeparator);
    FileWriter::WriteLogTag
              (writer,logTag,*(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 0x18),CommaSeparator);
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void CreateScriptContext_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTCreateScriptContextAction* cAction = GetInlineEventDataAs<JsRTCreateScriptContextAction, EventKind::CreateScriptContextActionTag>(evt);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->GlobalObject, NSTokens::Separator::NoSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->UndefinedObject, NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->NullObject, NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->TrueObject, NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->FalseObject, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceEnd();
        }